

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourcesGL.hpp
# Opt level: O3

ImageInfo * __thiscall Diligent::ShaderResourcesGL::GetImage(ShaderResourcesGL *this,Uint32 Index)

{
  char (*in_R8) [18];
  string msg;
  Uint32 local_34;
  string local_30;
  
  if (this->m_NumImages <= Index) {
    local_34 = Index;
    FormatString<char[14],unsigned_int,char[18]>
              (&local_30,(Diligent *)"Image index (",(char (*) [14])&local_34,
               (uint *)") is out of range",in_R8);
    DebugAssertionFailed
              (local_30._M_dataplus._M_p,"GetImage",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/include/ShaderResourcesGL.hpp"
               ,0x125);
    Index = local_34;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
      Index = local_34;
    }
  }
  return this->m_Images + Index;
}

Assistant:

ImageInfo& GetImage(Uint32 Index)
    {
        VERIFY(Index < m_NumImages, "Image index (", Index, ") is out of range");
        return m_Images[Index];
    }